

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O3

uint __thiscall
BTree<EntryBTree,EntryKey>::traverse<EntryUnpacker_const>
          (BTree<EntryBTree,EntryKey> *this,EntryUnpacker *traverseFunctor)

{
  uint uVar1;
  bool bVar2;
  ushort uVar3;
  uint8_t *puVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  undefined2 *puVar10;
  EntryKey key;
  uint local_60;
  uint local_5c;
  ushort local_54;
  KeyType local_40;
  
  uVar5 = *(ushort *)(*(long *)this + 4);
  if (uVar5 == 0) {
    local_60 = 0;
  }
  else {
    uVar3 = uVar5 << 8 | uVar5 >> 8;
    puVar10 = (undefined2 *)(*(long *)this + 6);
    local_60 = 0;
    local_5c = 0;
    uVar5 = 1;
    if (1 < uVar3) {
      uVar5 = uVar3;
    }
    do {
      uVar3 = swap_bytes(*puVar10);
      uVar8 = 0;
      uVar7 = uVar3 >> 4 & 0x7ff;
      uVar6 = swap_bytes(*(undefined2 *)((long)puVar10 + (ulong)(uVar7 * 0xc + 0xc >> 3)));
      local_54 = uVar6 >> ((byte)uVar3 >> 2 & 4) & 0xfff;
      while (uVar8 < uVar7) {
        iVar9 = uVar8 << 2;
        uVar1 = uVar8 * 0xc;
        while( true ) {
          uVar8 = uVar8 + 1;
          uVar1 = uVar1 + 0xc;
          uVar3 = swap_bytes(*(undefined2 *)((long)puVar10 + (ulong)(uVar1 >> 3)));
          local_40.m_flags = 0;
          local_40.m_nameIndex = 0xffffffff;
          local_40.m_extIndex = 0xffffffff;
          local_40.m_linkIndex = 0xffffffff;
          puVar4 = EntryBTree::parseData
                             ((EntryBTree *)this,&local_40,
                              (uint8_t *)
                              ((ulong)(uVar3 >> ((byte)iVar9 & 4) & 0xfff) + (long)puVar10));
          if (puVar4 != (uint8_t *)0x0) break;
          iVar9 = iVar9 + 4;
          if ((1 - uVar7) + uVar8 == 1) goto LAB_0011df47;
        }
        local_60 = local_60 + 1;
        bVar2 = EntryUnpacker::operator()(traverseFunctor,&local_40);
        if (!bVar2) {
          return local_60;
        }
      }
LAB_0011df47:
      local_5c = local_5c + 1;
      puVar10 = (undefined2 *)((long)puVar10 + (ulong)local_54);
    } while (local_5c != uVar5);
  }
  return local_60;
}

Assistant:

unsigned int traverse(TraverseFunctor& traverseFunctor) const
	{
		const auto& self = static_cast<const Derived&>(*this);

		auto p = m_data;
		
		const auto offsetAndCount = readNextWithByteSwap<uint32_t>(p);
		const auto nodeCount = readNextWithByteSwap<uint16_t>(p);
		
		UNUSED(offsetAndCount);
		
		auto visitedKeyCount = 0u;
		for (auto i = 0u; i < nodeCount; ++i) {
			const auto high = getBitsAt(p, 0) & UINT32_C(0x7FF);
			const auto nextOffset = getBitsAt(p, high + 1);
			
			for (auto j = 0u; j < high; ++j) {
				const auto offset = getBitsAt(p, j + 1);
				const auto data = advancePointer(p, offset);
				
				Key key;
				if (self.parseData(key, data)) {
					++visitedKeyCount;
					if (!traverseFunctor(key))
						goto done;
				}
			}
			
			p = advancePointer(p, nextOffset);
		}
		
	done:
		return visitedKeyCount;
	}